

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_1U>::getSFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_1U> *this,uint32_t numChannels,uint32_t targetBits)

{
  Color CVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  uint32_t x;
  uint uVar3;
  float *__src;
  uint uVar4;
  uint uVar5;
  anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3 *__dest;
  uint32_t y;
  uint uVar6;
  uint16_t outValue_1;
  allocator_type local_41;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  float outValue;
  
  if (1 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 1>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 1]"
                 );
  }
  if ((targetBits != 0x10) && (targetBits != 0x20)) {
    __assert_fail("targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38f,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 1>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 1]"
                 );
  }
  uVar4 = targetBits >> 3;
  local_40 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(uVar4 * numChannels * (this->super_Image).height * (this->super_Image).width),
             &local_41);
  uVar6 = 0;
  pvVar2 = local_40;
  do {
    if ((this->super_Image).height <= uVar6) {
      return pvVar2;
    }
    for (uVar3 = 0; uVar3 < (this->super_Image).width; uVar3 = uVar3 + 1) {
      uVar5 = 0;
LAB_0011ebee:
      if (uVar5 < numChannels) {
        uVar5 = (this->super_Image).width * uVar6 + uVar3;
        CVar1.field_0 =
             (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)
             this->pixels[uVar5].field_0.comps[0];
        __dest = (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3 *)
                 ((pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start + uVar5 * uVar4);
        if (targetBits == 0x20) {
          outValue = (float)(byte)CVar1.field_0;
          __src = &outValue;
        }
        else {
          if (targetBits != 0x10) {
            uVar5 = 1;
            if (targetBits == 8) {
              __dest->comps[0] = (uchar)CVar1.field_0;
              uVar5 = 1;
            }
            goto LAB_0011ebee;
          }
          outValue_1 = imageio::float_to_half((float)(byte)CVar1.field_0);
          __src = (float *)&outValue_1;
        }
        memcpy(__dest,__src,(ulong)uVar4);
        uVar5 = 1;
        pvVar2 = local_40;
        goto LAB_0011ebee;
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }